

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

int BrotliEncoderCompress
              (int quality,int lgwin,BrotliEncoderMode mode,size_t input_size,uint8_t *input_buffer,
              size_t *encoded_size,uint8_t *encoded_buffer)

{
  uint8_t prev_byte;
  ulong uVar1;
  uint32_t num_distance_codes;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined2 uVar6;
  uint uVar7;
  int iVar8;
  ContextType literal_context_mode;
  size_t i;
  ulong uVar9;
  BrotliEncoderState *s;
  ulong uVar10;
  ulong uVar11;
  int *piVar12;
  long lVar13;
  ZopfliNode *array;
  Command_conflict *__dest;
  uint8_t *puVar14;
  char cVar15;
  byte bVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  uint8_t *puVar24;
  size_t sVar25;
  HasherCommon *common;
  size_t sVar26;
  ulong uVar27;
  uint8_t **ppuVar28;
  int *piVar29;
  ulong uVar30;
  size_t *psVar31;
  Command_conflict *cmds;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  size_t sVar36;
  ulong uVar37;
  long lVar38;
  uint uVar39;
  ulong uVar40;
  size_t sVar41;
  uint8_t *puVar42;
  ulong uVar43;
  bool bVar44;
  byte bVar45;
  ulong local_360;
  size_t local_358;
  size_t local_350;
  ulong local_348;
  int *local_340;
  uint8_t *local_338;
  ulong local_330;
  ulong local_328;
  ulong local_320;
  ulong local_318;
  size_t num_literals;
  int dist_cache [4];
  MemoryManager memory_manager;
  ulong local_2d0;
  ulong local_2b8;
  ulong local_298;
  uint8_t *local_290;
  size_t last_insert_len;
  uint8_t *next_in;
  uint local_250;
  uint local_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  int iStack_240;
  int local_23c;
  uint local_238;
  uint uStack_234;
  int iStack_230;
  int iStack_22c;
  int local_228;
  BrotliDistanceParams local_220;
  BrotliEncoderDictionary local_208;
  int saved_dist_cache [4];
  size_t available_in;
  BlockSplit local_160;
  BlockSplit local_130;
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  size_t available_out;
  uint local_70;
  
  bVar45 = 0;
  local_350 = *encoded_size;
  if (input_size == 0) {
    if (local_350 == 0) {
      return 0;
    }
    *encoded_size = 1;
    *encoded_buffer = '\x06';
    goto LAB_00105b1a;
  }
  uVar9 = input_size + (input_size >> 0xe) * 4 + 6;
  uVar18 = 0;
  if (input_size <= uVar9) {
    uVar18 = uVar9;
  }
  if (local_350 == 0) {
    return 0;
  }
  local_338 = input_buffer;
  if (quality != 10) {
    s = BrotliEncoderCreateInstance((brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
    if (s == (BrotliEncoderState *)0x0) {
      return 0;
    }
    available_out = *encoded_size;
    memory_manager.alloc_func = (brotli_alloc_func)encoded_buffer;
    dist_cache[0] = 0;
    dist_cache[1] = 0;
    if (s->is_initialized_ == 0) {
      (s->params).quality = quality;
      (s->params).lgwin = lgwin;
      (s->params).mode = mode;
      (s->params).size_hint = input_size & 0xffffffff;
      if (0x18 < lgwin) {
        (s->params).large_window = 1;
      }
    }
    next_in = input_buffer;
    available_in = input_size;
    iVar8 = BrotliEncoderCompressStream
                      (s,BROTLI_OPERATION_FINISH,&available_in,&next_in,&available_out,
                       (uint8_t **)&memory_manager,(size_t *)dist_cache);
    if ((s->stream_state_ != BROTLI_STREAM_FINISHED) || (s->available_out_ != 0)) {
      iVar8 = 0;
    }
    *encoded_size = dist_cache._0_8_;
    BrotliEncoderDestroyInstance(s);
    if ((iVar8 != 0) && ((uVar18 == 0 || (*encoded_size <= uVar18)))) goto LAB_00105b1a;
    goto LAB_00105a20;
  }
  uVar39 = 0x10;
  if (0x10 < lgwin) {
    uVar39 = lgwin;
  }
  uVar7 = 0x1e;
  if ((int)uVar39 < 0x1e) {
    uVar7 = uVar39;
  }
  uVar35 = 1L << ((byte)uVar7 & 0x3f);
  dist_cache[0] = 4;
  dist_cache[1] = 0xb;
  dist_cache[2] = 0xf;
  dist_cache[3] = 0x10;
  uVar9 = uVar35;
  if (input_size < uVar35) {
    uVar9 = input_size;
  }
  cVar15 = '\x17';
  if ((int)uVar39 < 0x17) {
    cVar15 = (char)uVar39;
  }
  uVar21 = 1L << (cVar15 + 1U & 0x3f);
  saved_dist_cache[0] = 4;
  saved_dist_cache[1] = 0xb;
  saved_dist_cache[2] = 0xf;
  saved_dist_cache[3] = 0x10;
  next_in = (uint8_t *)0xb00000000;
  local_23c = 0;
  local_250 = 0x16;
  local_24c = 0;
  uStack_248 = 0;
  uStack_244 = 0;
  iStack_240 = 0;
  BrotliInitEncoderDictionary(&local_208);
  local_220.distance_postfix_bits = 0;
  local_220.num_direct_distance_codes = 0;
  local_220.alphabet_size = 0x40;
  local_220.max_distance = 0x3fffffc;
  uVar39 = uVar7;
  local_250 = uVar7;
  if (lgwin < 0x19) {
    uVar17 = 0x1e;
    if (local_23c == 0) {
      uVar17 = 0x18;
    }
    if (uVar17 < uVar7) {
      uVar39 = 0x18;
      local_250 = uVar17;
    }
  }
  else {
    local_23c = 1;
  }
  next_in = (uint8_t *)CONCAT44(10,next_in._0_4_);
  if (local_24c == 0) {
    local_24c = 0x10;
    if ((0x10 < uVar39) && (local_24c = 0x12, uVar39 < 0x12)) {
      local_24c = uVar39;
    }
  }
  else {
    uVar39 = 0x10;
    if (0x10 < (int)local_24c) {
      uVar39 = local_24c;
    }
    local_24c = 0x18;
    if ((int)uVar39 < 0x18) {
      local_24c = uVar39;
    }
  }
  ChooseDistanceParams((BrotliEncoderParams *)&next_in);
  uVar10 = 1L << ((byte)local_24c & 0x3f);
  BrotliInitMemoryManager(&memory_manager,(brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
  if (local_23c == 0) {
    if (uVar7 == 0x10) {
      uVar39 = 0;
      local_348 = 1;
    }
    else if (uVar7 == 0x11) {
      local_348 = 7;
      uVar39 = 1;
    }
    else {
      uVar39 = uVar7 * 2 - 0x21;
      local_348 = 4;
    }
  }
  else {
    uVar39 = uVar7 << 8 | 0x11;
    local_348 = 0xe;
  }
  if (9 < (int)next_in._4_4_) {
    local_238 = 10;
    uVar11 = 1L << ((byte)local_250 & 0x3f);
    if (uVar9 <= uVar11) {
      uVar11 = uVar9;
    }
    sVar26 = uVar11 * 8 + 0x80038;
    goto switchD_00104b43_default;
  }
  local_238 = next_in._4_4_;
  if (next_in._4_4_ == 4) {
    if (0xfffff < CONCAT44(uStack_244,uStack_248)) {
      local_238 = 0x36;
      sVar26 = 0x400038;
      goto switchD_00104b43_default;
    }
  }
  else if (4 < (int)next_in._4_4_) {
    if ((int)local_250 < 0x11) {
      local_238 = 0x28;
      if (6 < next_in._4_4_) {
        local_238 = 0x2a - (next_in._4_4_ < 9);
      }
    }
    else {
      if ((local_250 < 0x13) || (CONCAT44(uStack_244,uStack_248) < 0x100000)) {
        uStack_234 = next_in._4_4_ < 7 ^ 0xf;
        local_238 = 5;
      }
      else {
        iStack_22c = 5;
        uStack_234 = 0xf;
        local_238 = 6;
      }
      iVar8 = 0x10;
      if (next_in._4_4_ < 9) {
        iVar8 = 10;
      }
      local_228 = 4;
      if (6 < next_in._4_4_) {
        local_228 = iVar8;
      }
      iStack_230 = next_in._4_4_ - 1;
    }
  }
  sVar26 = 0x28;
  if (0x27 < (int)local_238) {
    if ((local_238 == 0x28) || (local_238 == 0x29)) goto switchD_00104b43_caseD_4;
    if (local_238 == 0x2a) {
      sVar26 = 0x140430;
    }
    goto switchD_00104b43_default;
  }
  switch(local_238) {
  case 2:
    sVar26 = 0x4002c;
    break;
  case 3:
    sVar26 = 0x40030;
    break;
  case 4:
switchD_00104b43_caseD_4:
    sVar26 = 0x80038;
    break;
  case 5:
    lVar13 = 0x40;
    goto LAB_00105ba5;
  case 6:
    lVar13 = 0x50;
LAB_00105ba5:
    sVar26 = ((4L << ((byte)iStack_230 & 0x3f) | 2U) << ((byte)uStack_234 & 0x3f)) + lVar13;
    if (sVar26 != 0) break;
    piVar12 = (int *)0x0;
    goto LAB_001049a4;
  }
switchD_00104b43_default:
  piVar12 = (int *)BrotliAllocate(&memory_manager,sVar26);
LAB_001049a4:
  *(ulong *)piVar12 = CONCAT44(uStack_234,local_238);
  *(ulong *)(piVar12 + 2) = CONCAT44(iStack_22c,iStack_230);
  piVar12[4] = local_228;
  iVar8 = *piVar12;
  if (iVar8 < 0x28) {
    if (iVar8 == 5) {
      iVar8 = 0x20 - piVar12[1];
      bVar16 = (byte)piVar12[1];
      uVar11 = 1L << (bVar16 & 0x3f);
      piVar12[0xe] = iVar8;
      *(ulong *)(piVar12 + 10) = uVar11;
      lVar13 = 1L << (*(byte *)(piVar12 + 2) & 0x3f);
      *(long *)(piVar12 + 0xc) = lVar13;
      piVar12[0xf] = (int)lVar13 + -1;
      piVar12[5] = 0;
      piVar29 = piVar12 + 0x10;
      if (uVar11 >> 6 < uVar9) {
LAB_00104cea:
        sVar25 = 2L << (bVar16 & 0x3f);
LAB_00104e7f:
        memset(piVar29,0,sVar25);
      }
      else {
        uVar11 = 0;
        do {
          *(undefined2 *)
           ((long)piVar29 +
           (ulong)((uint)(*(int *)(input_buffer + uVar11) * 0x1e35a7bd) >> ((byte)iVar8 & 0x1f)) * 2
           ) = 0;
          uVar11 = uVar11 + 1;
        } while (uVar9 != uVar11);
      }
    }
    else if (iVar8 == 6) {
      iVar8 = 0x40 - piVar12[1];
      piVar12[0xe] = iVar8;
      uVar11 = 0xffffffffffffffff >> ((char)piVar12[3] * -8 & 0x3fU);
      bVar16 = (byte)piVar12[1];
      uVar37 = 1L << (bVar16 & 0x3f);
      *(ulong *)(piVar12 + 0x10) = uVar11;
      *(ulong *)(piVar12 + 10) = uVar37;
      lVar13 = 1L << (*(byte *)(piVar12 + 2) & 0x3f);
      *(long *)(piVar12 + 0xc) = lVar13;
      piVar12[0x12] = (int)lVar13 + -1;
      piVar12[5] = 0;
      piVar29 = piVar12 + 0x14;
      if (uVar37 >> 6 < uVar9) goto LAB_00104cea;
      uVar37 = 0;
      do {
        *(undefined2 *)
         ((long)piVar29 +
         ((*(ulong *)(input_buffer + uVar37) & uVar11) * 0x1fe35a7bd3579bd3 >> ((byte)iVar8 & 0x3f)
         & 0xffffffff) * 2) = 0;
        uVar37 = uVar37 + 1;
      } while (uVar9 != uVar37);
    }
    else if (iVar8 == 10) {
      uVar7 = -1 << ((byte)local_250 & 0x1f);
      iVar8 = uVar7 + 1;
      *(ulong *)(piVar12 + 10) = (ulong)~uVar7;
      piVar12[0x2000c] = iVar8;
      piVar12[5] = 0;
      lVar13 = 0;
      do {
        piVar29 = piVar12 + lVar13 + 0xc;
        *piVar29 = iVar8;
        piVar29[1] = iVar8;
        piVar29[2] = iVar8;
        piVar29[3] = iVar8;
        lVar13 = lVar13 + 4;
      } while (lVar13 != 0x20000);
    }
    else {
LAB_00104c25:
      piVar12[5] = 0;
      if (iVar8 < 4) {
        if (iVar8 == 2) {
          piVar29 = piVar12 + 10;
          if (0x800 < uVar9) {
            sVar25 = 0x40004;
            goto LAB_00104e7f;
          }
          uVar11 = 0;
          do {
            piVar29[(ulong)(*(long *)(input_buffer + uVar11) * -0x42e1ca5843000000) >> 0x30] = 0;
            uVar11 = uVar11 + 1;
          } while (uVar9 != uVar11);
        }
        else if (iVar8 == 3) {
          piVar29 = piVar12 + 10;
          if (0x800 < uVar9) {
            sVar25 = 0x40008;
            goto LAB_00104e7f;
          }
          uVar11 = 0;
          do {
            lVar13 = *(long *)(input_buffer + uVar11);
            (piVar29 + ((ulong)(lVar13 * -0x42e1ca5843000000) >> 0x30))[0] = 0;
            (piVar29 + ((ulong)(lVar13 * -0x42e1ca5843000000) >> 0x30))[1] = 0;
            uVar11 = uVar11 + 1;
          } while (uVar9 != uVar11);
        }
      }
      else if (iVar8 == 4) {
        piVar29 = piVar12 + 10;
        if (0x1000 < uVar9) {
          sVar25 = 0x80010;
          goto LAB_00104e7f;
        }
        uVar11 = 0;
        do {
          *(undefined1 (*) [16])
           (piVar29 + ((ulong)(*(long *)(input_buffer + uVar11) * -0x42e1ca5843000000) >> 0x2f)) =
               (undefined1  [16])0x0;
          uVar11 = uVar11 + 1;
        } while (uVar9 != uVar11);
      }
      else if (iVar8 == 0x36) {
        piVar29 = piVar12 + 10;
        if (0x8000 < uVar9) {
          sVar25 = 0x400010;
          goto LAB_00104e7f;
        }
        uVar11 = 0;
        do {
          *(undefined1 (*) [16])
           (piVar29 + ((ulong)(*(long *)(input_buffer + uVar11) * 0x35a7bd1e35a7bd00) >> 0x2c)) =
               (undefined1  [16])0x0;
          uVar11 = uVar11 + 1;
        } while (uVar9 != uVar11);
      }
    }
  }
  else {
    cVar15 = (char)((ulong)next_in >> 0x20);
    if (iVar8 == 0x28) {
      *(ulong *)(piVar12 + 0x2000c) = (ulong)(((int)next_in._4_4_ < 7) + 7 << (cVar15 - 4U & 0x1f));
      piVar12[5] = 0;
      if (uVar9 < 0x201) {
        uVar11 = 0;
        do {
          uVar37 = (ulong)((uint)(*(int *)(input_buffer + uVar11) * 0x1e35a7bd) >> 0x11);
          piVar12[uVar37 + 10] = -0x33333334;
          *(undefined2 *)((long)piVar12 + uVar37 * 2 + 0x20028) = 0xcccc;
          uVar11 = uVar11 + 1;
        } while (uVar9 != uVar11);
      }
      else {
LAB_00104d49:
        memset(piVar12 + 10,0xcc,0x20000);
        memset(piVar12 + 0x800a,0,0x10000);
      }
    }
    else {
      if (iVar8 != 0x29) {
        if (iVar8 != 0x2a) goto LAB_00104c25;
        *(ulong *)(piVar12 + 0x5010a) =
             (ulong)(((int)next_in._4_4_ < 7) + 7 << (cVar15 - 4U & 0x1f));
        piVar12[5] = 0;
        if (uVar9 < 0x201) {
          uVar11 = 0;
          do {
            uVar37 = (ulong)((uint)(*(int *)(input_buffer + uVar11) * 0x1e35a7bd) >> 0x11);
            piVar12[uVar37 + 10] = -0x33333334;
            *(undefined2 *)((long)piVar12 + uVar37 * 2 + 0x20028) = 0xcccc;
            uVar11 = uVar11 + 1;
          } while (uVar9 != uVar11);
        }
        else {
          memset(piVar12 + 10,0xcc,0x20000);
          memset(piVar12 + 0x800a,0,0x10000);
        }
        memset(piVar12 + 0xc00a,0,0x10000);
        piVar29 = piVar12 + 0x5000a;
        sVar25 = 0x400;
        goto LAB_00104e7f;
      }
      *(ulong *)(piVar12 + 0x2000c) = (ulong)(((int)next_in._4_4_ < 7) + 7 << (cVar15 - 4U & 0x1f));
      piVar12[5] = 0;
      if (0x200 < uVar9) goto LAB_00104d49;
      uVar11 = 0;
      do {
        uVar37 = (ulong)((uint)(*(int *)(input_buffer + uVar11) * 0x1e35a7bd) >> 0x11);
        piVar12[uVar37 + 10] = -0x33333334;
        *(undefined2 *)((long)piVar12 + uVar37 * 2 + 0x20028) = 0xcccc;
        uVar11 = uVar11 + 1;
      } while (uVar9 != uVar11);
    }
    memset(piVar12 + 0xc00a,0,0x10000);
    *(undefined2 *)(piVar12 + 0x2000a) = 0;
  }
  uVar9 = uVar21 >> 3;
  *(undefined1 (*) [16])(piVar12 + 6) = (undefined1  [16])0x0;
  piVar12[5] = 1;
  local_290 = encoded_buffer;
  local_330 = 0;
  prev_byte = '\0';
  local_298 = 0;
  sVar26 = 0;
  local_340 = piVar12;
  do {
    uVar11 = uVar21 + sVar26;
    if (input_size < uVar11) {
      uVar11 = input_size;
    }
    last_insert_len = 0;
    num_literals = 0;
    if (((int)next_in._4_4_ < 10) ||
       (iVar8 = BrotliIsMostlyUTF8(input_buffer,sVar26,0x7fffffffffffffff,uVar11 - sVar26,0.75),
       iVar8 != 0)) {
      literal_context_mode = CONTEXT_UTF8;
    }
    else {
      literal_context_mode = CONTEXT_SIGNED;
    }
    uVar43 = (uVar11 - sVar26) / 0xc + 0x10;
    local_358 = 0;
    local_2d0 = 0;
    cmds = (Command_conflict *)0x0;
    uVar37 = 0;
    sVar41 = sVar26;
    piVar12 = local_340;
    while (uVar19 = uVar11 - sVar41, sVar41 <= uVar11 && uVar19 != 0) {
      local_328 = uVar19;
      if (uVar10 <= uVar19) {
        local_328 = uVar10;
      }
      sVar36 = local_328 + 1;
      if (sVar36 == 0) {
        array = (ZopfliNode *)0x0;
      }
      else {
        array = (ZopfliNode *)BrotliAllocate(&memory_manager,sVar36 * 0x10);
      }
      BrotliInitZopfliNodes(array,sVar36);
      if ((0x7f < sVar41) && (2 < local_328)) {
        uVar19 = sVar41 - 0x7f;
        uVar22 = (local_328 + sVar41) - 0x7f;
        if (sVar41 < uVar22) {
          uVar22 = sVar41;
        }
        if (uVar19 < uVar22) {
          uVar1 = *(ulong *)(piVar12 + 10);
          puVar14 = input_buffer;
          do {
            uVar20 = sVar41 - uVar19;
            if (uVar20 < 0x10) {
              uVar20 = 0xf;
            }
            uVar23 = (ulong)((uint)(*(int *)(puVar14 + (uVar19 & 0x7fffffffffffffff)) * 0x1e35a7bd)
                            >> 0xf);
            uVar32 = (ulong)(uint)piVar12[uVar23 + 0xc];
            local_2b8 = (uVar19 & uVar1) * 2 + 1;
            local_320 = (uVar19 & uVar1) * 2;
            piVar12[uVar23 + 0xc] = (int)uVar19;
            input_buffer = puVar14;
            if (uVar19 != uVar32) {
              lVar13 = 0x40;
              uVar23 = 0;
              local_318 = 0;
              puVar42 = puVar14;
LAB_00105145:
              bVar44 = lVar13 != 0;
              lVar13 = lVar13 + -1;
              input_buffer = puVar42;
              if ((uVar19 - uVar32 <= uVar1 - uVar20) && (bVar44)) {
                uVar33 = uVar23;
                if (local_318 < uVar23) {
                  uVar33 = local_318;
                }
                puVar24 = puVar42 + uVar33 + uVar32;
                uVar27 = 0x80 - uVar33;
                if (7 < uVar27) {
                  uVar40 = uVar27 & 0xfffffffffffffff8;
                  lVar38 = 0;
                  uVar30 = 0;
LAB_001051c8:
                  input_buffer = local_338;
                  if (*(ulong *)(puVar24 + uVar30 * 8) ==
                      *(ulong *)(puVar14 + uVar30 * 8 + uVar33 + (uVar19 & 0x7fffffffffffffff)))
                  goto code_r0x001051d5;
                  uVar30 = *(ulong *)(puVar14 + uVar30 * 8 + uVar33 + (uVar19 & 0x7fffffffffffffff))
                           ^ *(ulong *)(puVar24 + uVar30 * 8);
                  uVar27 = 0;
                  if (uVar30 != 0) {
                    for (; (uVar30 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                    }
                  }
                  uVar30 = (uVar27 >> 3 & 0x1fffffff) - lVar38;
                  goto LAB_00105221;
                }
                uVar40 = 0;
                goto LAB_001052ac;
              }
            }
LAB_001050b8:
            iVar8 = piVar12[0x2000c];
            piVar12[local_320 + 0x2000e] = iVar8;
LAB_001050cc:
            piVar12[local_2b8 + 0x2000e] = iVar8;
            uVar19 = uVar19 + 1;
            puVar14 = input_buffer;
          } while (uVar19 != uVar22);
        }
      }
      sVar36 = BrotliZopfliComputeShortestPath
                         (&memory_manager,local_328,sVar41,input_buffer,0x7fffffffffffffff,
                          (BrotliEncoderParams *)&next_in,uVar35 - 0x10,dist_cache,
                          (HasherHandle)piVar12,array);
      uVar19 = sVar36 + uVar37 + 1;
      if (uVar19 < uVar43) {
        uVar19 = uVar43;
      }
      __dest = cmds;
      if ((local_2d0 != uVar19) &&
         (__dest = (Command_conflict *)BrotliAllocate(&memory_manager,uVar19 << 4),
         local_2d0 = uVar19, cmds != (Command_conflict *)0x0)) {
        memcpy(__dest,cmds,uVar37 << 4);
        BrotliFree(&memory_manager,cmds);
      }
      cmds = __dest;
      uVar19 = local_328;
      uVar22 = sVar36 + uVar37;
      BrotliZopfliCreateCommands
                (local_328,sVar41,uVar35 - 0x10,array,dist_cache,&last_insert_len,
                 (BrotliEncoderParams *)&next_in,cmds + uVar37,&num_literals);
      local_358 = local_358 + uVar19;
      BrotliFree(&memory_manager,array);
      uVar37 = uVar22;
      input_buffer = local_338;
      if ((uVar9 < uVar22) || (sVar41 = sVar41 + uVar19, uVar9 < num_literals)) break;
    }
    sVar41 = local_358;
    if (last_insert_len != 0) {
      cmds[uVar37].insert_len_ = (uint32_t)last_insert_len;
      cmds[uVar37].copy_len_ = 0x8000000;
      cmds[uVar37].dist_extra_ = 0;
      cmds[uVar37].dist_prefix_ = 0x10;
      if (last_insert_len < 6) {
        uVar11 = last_insert_len & 0xffffffff;
      }
      else if (last_insert_len < 0x82) {
        uVar7 = 0x1f;
        uVar17 = (uint)(last_insert_len - 2);
        if (uVar17 != 0) {
          for (; uVar17 >> uVar7 == 0; uVar7 = uVar7 - 1) {
          }
        }
        uVar11 = (ulong)((int)(last_insert_len - 2 >> ((char)(uVar7 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                         (uVar7 ^ 0xffffffe0) * 2 + 0x40);
      }
      else if (last_insert_len < 0x842) {
        uVar17 = (uint32_t)last_insert_len - 0x42;
        uVar7 = 0x1f;
        if (uVar17 != 0) {
          for (; uVar17 >> uVar7 == 0; uVar7 = uVar7 - 1) {
          }
        }
        uVar11 = (ulong)((uVar7 ^ 0xffe0) + 0x2a);
      }
      else {
        uVar11 = 0x15;
        if (0x1841 < last_insert_len) {
          uVar11 = (ulong)(ushort)(0x17 - (last_insert_len < 0x5842));
        }
      }
      iVar8 = (int)((uVar11 & 0xffff) >> 3) * 3;
      cmds[uVar37].cmd_prefix_ =
           ((ushort)(0x520d40 >> ((char)iVar8 * '\x02' & 0x1fU)) & 0xc0) + (short)iVar8 * 0x40 +
           ((ushort)uVar11 & 7) * 8 + 0x42;
      num_literals = num_literals + last_insert_len;
      uVar37 = uVar37 + 1;
    }
    uVar11 = local_358 + sVar26;
    local_360 = local_348;
    uVar6 = (undefined2)uVar39;
    if (local_358 == 0) {
      puVar14 = (uint8_t *)BrotliAllocate(&memory_manager,0x10);
      *(undefined2 *)puVar14 = uVar6;
      *(ulong *)(puVar14 + (local_360 >> 3)) =
           3L << ((byte)local_360 & 7) | (ulong)puVar14[local_360 >> 3];
      local_360 = (ulong)((int)local_360 + 9U & 0xfffffff8);
    }
    else {
      iVar8 = ShouldCompress(input_buffer,0x7fffffffffffffff,sVar26,local_358,num_literals,uVar37);
      uVar7 = (uint)(uVar11 == input_size);
      if (iVar8 == 0) {
        dist_cache[0] = saved_dist_cache[0];
        dist_cache[1] = saved_dist_cache[1];
        dist_cache[2] = saved_dist_cache[2];
        dist_cache[3] = saved_dist_cache[3];
        puVar14 = (uint8_t *)BrotliAllocate(&memory_manager,sVar41 + 0x10);
        *(undefined2 *)puVar14 = uVar6;
        BrotliStoreUncompressedMetaBlock
                  (uVar7,input_buffer,sVar26,0x7fffffffffffffff,sVar41,&local_360,puVar14);
      }
      else {
        ppuVar28 = &next_in;
        psVar31 = &available_out;
        for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
          *psVar31 = (size_t)*ppuVar28;
          ppuVar28 = ppuVar28 + (ulong)bVar45 * -2 + 1;
          psVar31 = psVar31 + (ulong)bVar45 * -2 + 1;
        }
        BrotliInitBlockSplit((BlockSplit *)&available_in);
        BrotliInitBlockSplit(&local_160);
        BrotliInitBlockSplit(&local_130);
        local_c0 = (undefined1  [16])0x0;
        local_d0 = (undefined1  [16])0x0;
        local_e0 = (undefined1  [16])0x0;
        local_f0 = (undefined1  [16])0x0;
        local_100 = (undefined1  [16])0x0;
        local_318 = local_298;
        BrotliBuildMetaBlock
                  (&memory_manager,input_buffer,sVar26,0x7fffffffffffffff,
                   (BrotliEncoderParams *)&available_out,prev_byte,(uint8_t)local_298,cmds,uVar37,
                   literal_context_mode,(MetaBlockSplit *)&available_in);
        num_distance_codes = local_70;
        if (0x21f < local_70) {
          num_distance_codes = 0x220;
        }
        BrotliOptimizeHistograms(num_distance_codes,(MetaBlockSplit *)&available_in);
        puVar14 = (uint8_t *)BrotliAllocate(&memory_manager,local_358 * 2 + 0x1f7);
        sVar41 = local_358;
        *(undefined2 *)puVar14 = uVar6;
        BrotliStoreMetaBlock
                  (&memory_manager,input_buffer,sVar26,local_358,0x7fffffffffffffff,prev_byte,
                   (uint8_t)local_318,(uint)(uVar11 == input_size),
                   (BrotliEncoderParams *)&available_out,literal_context_mode,cmds,uVar37,
                   (MetaBlockSplit *)&available_in,&local_360,puVar14);
        if (sVar41 + 4 < local_360 >> 3) {
          dist_cache[0] = saved_dist_cache[0];
          dist_cache[1] = saved_dist_cache[1];
          dist_cache[2] = saved_dist_cache[2];
          dist_cache[3] = saved_dist_cache[3];
          *puVar14 = (uint8_t)uVar39;
          puVar14[1] = (uint8_t)(uVar39 >> 8);
          local_360 = local_348;
          BrotliStoreUncompressedMetaBlock
                    (uVar7,input_buffer,sVar26,0x7fffffffffffffff,sVar41,&local_360,puVar14);
        }
        BrotliDestroyBlockSplit(&memory_manager,(BlockSplit *)&available_in);
        BrotliDestroyBlockSplit(&memory_manager,&local_160);
        BrotliDestroyBlockSplit(&memory_manager,&local_130);
        BrotliFree(&memory_manager,(void *)local_100._0_8_);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_100._8_8_;
        local_100 = auVar2 << 0x40;
        BrotliFree(&memory_manager,(void *)local_f0._0_8_);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = local_f0._8_8_;
        local_f0 = auVar3 << 0x40;
        BrotliFree(&memory_manager,(void *)local_e0._0_8_);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_e0._8_8_;
        local_e0 = auVar4 << 0x40;
        BrotliFree(&memory_manager,(void *)local_d0._0_8_);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = local_d0._8_8_;
        local_d0 = auVar5 << 0x40;
        BrotliFree(&memory_manager,(void *)local_c0._0_8_);
      }
    }
    uVar37 = local_360 >> 3;
    uVar39 = (uint)puVar14[uVar37];
    if (uVar11 < input_size) {
      local_298 = (ulong)input_buffer[uVar11 - 2];
      prev_byte = input_buffer[uVar11 - 1];
    }
    local_348 = local_360;
    saved_dist_cache[0] = dist_cache[0];
    saved_dist_cache[1] = dist_cache[1];
    saved_dist_cache[2] = dist_cache[2];
    saved_dist_cache[3] = dist_cache[3];
    local_330 = local_330 + uVar37;
    if (local_330 <= local_350) {
      memcpy(local_290,puVar14,uVar37);
      local_290 = local_290 + uVar37;
    }
    BrotliFree(&memory_manager,puVar14);
    BrotliFree(&memory_manager,cmds);
    uVar37 = local_330;
  } while ((uVar11 < input_size) &&
          (local_348 = (ulong)((uint)local_348 & 7), sVar26 = uVar11, local_330 <= local_350));
  *encoded_size = local_330;
  BrotliFree(&memory_manager,local_340);
  if ((local_350 < uVar37) || ((iVar8 = 1, uVar18 != 0 && (uVar18 < *encoded_size)))) {
LAB_00105a20:
    *encoded_size = 0;
    iVar8 = 0;
    if (uVar18 - 1 < local_350) {
      encoded_buffer[0] = '!';
      encoded_buffer[1] = '\x03';
      lVar13 = 2;
      lVar38 = 0;
      do {
        sVar25 = 0x1000000;
        if (input_size < 0x1000000) {
          sVar25 = input_size;
        }
        iVar8 = 2 - (uint)(input_size < 0x100001);
        if (input_size < 0x10001) {
          iVar8 = 0;
        }
        uVar7 = ((int)sVar25 * 8 + iVar8 * 2) - 8;
        uVar39 = 0x80000 << ((byte)(iVar8 << 2) & 0x1f) | uVar7;
        encoded_buffer[lVar13] = (uint8_t)uVar7;
        encoded_buffer[lVar13 + 1] = (uint8_t)((uint)((int)sVar25 * 8 + -8) >> 8);
        encoded_buffer[lVar13 + 2] = (uint8_t)(uVar39 >> 0x10);
        if (input_size < 0x100001) {
          lVar13 = lVar13 + 3;
        }
        else {
          encoded_buffer[lVar13 + 3] = (uint8_t)(uVar39 >> 0x18);
          lVar13 = lVar13 + 4;
        }
        memcpy(encoded_buffer + lVar13,local_338 + lVar38,sVar25);
        lVar13 = lVar13 + sVar25;
        lVar38 = lVar38 + sVar25;
        input_size = input_size - sVar25;
      } while (input_size != 0);
      encoded_buffer[lVar13] = '\x03';
      *encoded_size = lVar13 + 1;
LAB_00105b1a:
      iVar8 = 1;
    }
  }
  return iVar8;
code_r0x001051d5:
  uVar30 = uVar30 + 1;
  lVar38 = lVar38 + -8;
  if (uVar27 >> 3 == uVar30) goto code_r0x001051e1;
  goto LAB_001051c8;
code_r0x001051e1:
  puVar24 = puVar24 + -lVar38;
LAB_001052ac:
  uVar27 = uVar27 & 7;
  uVar30 = uVar40;
  if (uVar27 != 0) {
    uVar34 = uVar40 | uVar27;
    do {
      uVar30 = uVar40;
      if (puVar14[uVar40 + uVar33 + (uVar19 & 0x7fffffffffffffff)] != *puVar24) break;
      puVar24 = puVar24 + 1;
      uVar40 = uVar40 + 1;
      uVar27 = uVar27 - 1;
      uVar30 = uVar34;
    } while (uVar27 != 0);
  }
LAB_00105221:
  uVar30 = uVar30 + uVar33;
  piVar12 = local_340;
  if (0x7f < uVar30) {
    local_340[local_320 + 0x2000e] = local_340[(uVar32 & uVar1) * 2 + 0x2000e];
    iVar8 = local_340[(uVar32 & uVar1) * 2 + 0x2000f];
    goto LAB_001050cc;
  }
  uVar33 = (uVar32 & uVar1) * 2;
  if (puVar42[uVar30 + uVar32] < puVar14[uVar30 + (uVar19 & 0x7fffffffffffffff)]) {
    local_340[local_320 + 0x2000e] = (int)uVar32;
    uVar33 = uVar33 | 1;
    local_320 = uVar33;
    local_318 = uVar30;
  }
  else {
    local_340[local_2b8 + 0x2000e] = (int)uVar32;
    uVar23 = uVar30;
    local_2b8 = uVar33;
  }
  uVar32 = (ulong)(uint)local_340[uVar33 + 0x2000e];
  puVar42 = input_buffer;
  if (uVar19 == uVar32) goto LAB_001050b8;
  goto LAB_00105145;
}

Assistant:

BROTLI_BOOL BrotliEncoderCompress(
    int quality, int lgwin, BrotliEncoderMode mode, size_t input_size,
    const uint8_t* input_buffer, size_t* encoded_size,
    uint8_t* encoded_buffer) {
  BrotliEncoderState* s;
  size_t out_size = *encoded_size;
  const uint8_t* input_start = input_buffer;
  uint8_t* output_start = encoded_buffer;
  size_t max_out_size = BrotliEncoderMaxCompressedSize(input_size);
  if (out_size == 0) {
    /* Output buffer needs at least one byte. */
    return BROTLI_FALSE;
  }
  if (input_size == 0) {
    /* Handle the special case of empty input. */
    *encoded_size = 1;
    *encoded_buffer = 6;
    return BROTLI_TRUE;
  }
  if (quality == 10) {
    /* TODO: Implement this direct path for all quality levels. */
    const int lg_win = BROTLI_MIN(int, BROTLI_LARGE_MAX_WINDOW_BITS,
                                       BROTLI_MAX(int, 16, lgwin));
    int ok = BrotliCompressBufferQuality10(lg_win, input_size, input_buffer,
                                           encoded_size, encoded_buffer);
    if (!ok || (max_out_size && *encoded_size > max_out_size)) {
      goto fallback;
    }
    return BROTLI_TRUE;
  }

  s = BrotliEncoderCreateInstance(0, 0, 0);
  if (!s) {
    return BROTLI_FALSE;
  } else {
    size_t available_in = input_size;
    const uint8_t* next_in = input_buffer;
    size_t available_out = *encoded_size;
    uint8_t* next_out = encoded_buffer;
    size_t total_out = 0;
    BROTLI_BOOL result = BROTLI_FALSE;
    BrotliEncoderSetParameter(s, BROTLI_PARAM_QUALITY, (uint32_t)quality);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_LGWIN, (uint32_t)lgwin);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_MODE, (uint32_t)mode);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_SIZE_HINT, (uint32_t)input_size);
    if (lgwin > BROTLI_MAX_WINDOW_BITS) {
      BrotliEncoderSetParameter(s, BROTLI_PARAM_LARGE_WINDOW, BROTLI_TRUE);
    }
    result = BrotliEncoderCompressStream(s, BROTLI_OPERATION_FINISH,
        &available_in, &next_in, &available_out, &next_out, &total_out);
    if (!BrotliEncoderIsFinished(s)) result = 0;
    *encoded_size = total_out;
    BrotliEncoderDestroyInstance(s);
    if (!result || (max_out_size && *encoded_size > max_out_size)) {
      goto fallback;
    }
    return BROTLI_TRUE;
  }
fallback:
  *encoded_size = 0;
  if (!max_out_size) return BROTLI_FALSE;
  if (out_size >= max_out_size) {
    *encoded_size =
        MakeUncompressedStream(input_start, input_size, output_start);
    return BROTLI_TRUE;
  }
  return BROTLI_FALSE;
}